

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O2

char * cmime_string_strip(char *s)

{
  char cVar1;
  size_t sVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,0x46,"char *cmime_string_strip(char *)");
  }
  sVar2 = strlen(s);
  pcVar4 = s;
  while ((cVar1 = *pcVar4, (long)cVar1 != 0 &&
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0))
        ) {
    pcVar4 = pcVar4 + 1;
  }
  pcVar5 = s + sVar2;
  while( true ) {
    pcVar5 = pcVar5 + -1;
    if (pcVar5 <= pcVar4) {
      return pcVar4;
    }
    ppuVar3 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar3 + (long)*pcVar5 * 2 + 1) & 0x20) == 0) break;
    *pcVar5 = '\0';
  }
  return pcVar4;
}

Assistant:

char *cmime_string_strip(char *s) {
    assert(s);

    char * e = s + strlen(s) - 1;
    while(*s && isspace(*s)) s++;
    while(e > s && isspace(*e)) *e-- = '\0';

    return(s);
}